

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O0

void display_object_recall_interactive(object *obj)

{
  textblock *tb_00;
  textblock *tb;
  char header_buf [120];
  object *obj_local;
  
  header_buf._112_8_ = obj;
  event_signal(EVENT_MESSAGE_FLUSH);
  tb_00 = object_info((object *)header_buf._112_8_,OINFO_NONE);
  object_desc((char *)&tb,0x78,(object *)header_buf._112_8_,0x43,player);
  textui_textblock_show(tb_00,(region_conflict)ZEXT816((ulong)0),(char *)&tb);
  textblock_free(tb_00);
  return;
}

Assistant:

void display_object_recall_interactive(struct object *obj)
{
	char header_buf[120];
	textblock *tb;

	event_signal(EVENT_MESSAGE_FLUSH);

	tb = object_info(obj, OINFO_NONE);
	object_desc(header_buf, sizeof(header_buf), obj,
		ODESC_PREFIX | ODESC_FULL, player);
	textui_textblock_show(tb, SCREEN_REGION, header_buf);
	textblock_free(tb);
}